

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_strip_tags(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  int local_40;
  int local_3c;
  int nLen;
  int nTaglen;
  char *zString;
  char *zTaglist;
  jx9_value **apArg_local;
  jx9_context *pjStack_18;
  int nArg_local;
  jx9_context *pCtx_local;
  
  zString = (char *)0x0;
  local_3c = 0;
  zTaglist = (char *)apArg;
  apArg_local._4_4_ = nArg;
  pjStack_18 = pCtx;
  if ((0 < nArg) && (iVar1 = jx9_value_is_string(*apArg), iVar1 != 0)) {
    _nLen = jx9_value_to_string(*(jx9_value **)zTaglist,&local_40);
    if ((1 < apArg_local._4_4_) &&
       (iVar1 = jx9_value_is_string(*(jx9_value **)(zTaglist + 8)), iVar1 != 0)) {
      zString = jx9_value_to_string(*(jx9_value **)(zTaglist + 8),&local_3c);
    }
    jx9StripTagsFromString(pjStack_18,_nLen,local_40,zString,local_3c);
    return 0;
  }
  jx9_result_string(pjStack_18,"",0);
  return 0;
}

Assistant:

static int jx9Builtin_strip_tags(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zTaglist = 0;
	const char *zString;
	int nTaglen = 0;
	int nLen;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid arguments, return the empty string */
		jx9_result_string(pCtx, "", 0);
		return JX9_OK;
	}
	/* Point to the raw string */
	zString = jx9_value_to_string(apArg[0], &nLen);
	if( nArg > 1 && jx9_value_is_string(apArg[1]) ){
		/* Allowed tag */
		zTaglist = jx9_value_to_string(apArg[1], &nTaglen);		
	}
	/* Process input */
	jx9StripTagsFromString(pCtx, zString, nLen, zTaglist, nTaglen);
	return JX9_OK;
}